

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_byte_array_decoder.cpp
# Opt level: O1

void duckdb::DeltaByteArrayDecoder::ReadDbpData
               (Allocator *allocator,ResizeableBuffer *buffer,ResizeableBuffer *result_buffer,
               idx_t *value_count)

{
  uint64_t *puVar1;
  idx_t iVar2;
  DbpDecoder *this;
  pointer pDVar3;
  uint64_t uVar4;
  templated_unique_single_t decoder;
  _Head_base<0UL,_duckdb::DbpDecoder_*,_false> local_30;
  
  this = (DbpDecoder *)operator_new(0x170);
  DbpDecoder::DbpDecoder
            (this,(buffer->super_ByteBuffer).ptr,(uint32_t)(buffer->super_ByteBuffer).len);
  local_30._M_head_impl = this;
  pDVar3 = unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true>::operator->
                     ((unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true>
                       *)&local_30);
  *value_count = pDVar3->total_value_count;
  iVar2 = result_buffer->alloc_len;
  (result_buffer->super_ByteBuffer).ptr = (result_buffer->allocated_data).pointer;
  (result_buffer->super_ByteBuffer).len = iVar2;
  ResizeableBuffer::resize(result_buffer,allocator,*value_count << 2);
  pDVar3 = unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true>::operator->
                     ((unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true>
                       *)&local_30);
  DbpDecoder::GetBatch<unsigned_int>(pDVar3,(result_buffer->super_ByteBuffer).ptr,*value_count);
  pDVar3 = unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true>::operator->
                     ((unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true>
                       *)&local_30);
  DbpDecoder::Finalize(pDVar3);
  uVar4 = (buffer->super_ByteBuffer).len;
  pDVar3 = unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true>::operator->
                     ((unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true>
                       *)&local_30);
  uVar4 = uVar4 - (pDVar3->buffer_).len;
  ByteBuffer::available(&buffer->super_ByteBuffer,uVar4);
  puVar1 = &(buffer->super_ByteBuffer).len;
  *puVar1 = *puVar1 - uVar4;
  (buffer->super_ByteBuffer).ptr = (buffer->super_ByteBuffer).ptr + uVar4;
  if (local_30._M_head_impl != (DbpDecoder *)0x0) {
    operator_delete(local_30._M_head_impl);
  }
  return;
}

Assistant:

void DeltaByteArrayDecoder::ReadDbpData(Allocator &allocator, ResizeableBuffer &buffer, ResizeableBuffer &result_buffer,
                                        idx_t &value_count) {
	auto decoder = make_uniq<DbpDecoder>(buffer.ptr, buffer.len);
	value_count = decoder->TotalValues();
	result_buffer.reset();
	result_buffer.resize(allocator, sizeof(uint32_t) * value_count);
	decoder->GetBatch<uint32_t>(result_buffer.ptr, value_count);
	decoder->Finalize();
	buffer.inc(buffer.len - decoder->BufferPtr().len);
}